

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeObjectSystem.cpp
# Opt level: O3

ProjectSettings * __thiscall
RuntimeObjectSystem::GetProject(RuntimeObjectSystem *this,unsigned_short projectId_)

{
  pointer pPVar1;
  ulong uVar2;
  undefined6 in_register_00000032;
  ulong uVar3;
  
  uVar3 = CONCAT62(in_register_00000032,projectId_) & 0xffffffff;
  pPVar1 = (this->m_Projects).
           super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = ((long)(this->m_Projects).
                 super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 3) *
          -0x7dc11f7047dc11f7;
  if (uVar2 < uVar3 || uVar2 - uVar3 == 0) {
    std::
    vector<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
    ::resize(&this->m_Projects,uVar3 + 1);
    pPVar1 = (this->m_Projects).
             super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  return pPVar1 + uVar3;
}

Assistant:

RuntimeObjectSystem::ProjectSettings& RuntimeObjectSystem::GetProject( unsigned short projectId_ )
{
    if( projectId_ >= m_Projects.size() )
    {
        m_Projects.resize(projectId_ + 1);
    }
    return m_Projects[ projectId_ ];
}